

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O1

void __thiscall
proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator::Clear
          (TestParsingMergeLite_RepeatedFieldsGenerator *this)

{
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypesLite>>
            ((RepeatedPtrFieldBase *)&(this->field_0)._impl_);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypesLite>>
            (&(this->field_0)._impl_.field2_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypesLite>>
            (&(this->field_0)._impl_.field3_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group1>>
            (&(this->field_0)._impl_.group1_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group2>>
            (&(this->field_0)._impl_.group2_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypesLite>>
            (&(this->field_0)._impl_.ext1_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypesLite>>
            (&(this->field_0)._impl_.ext2_.super_RepeatedPtrFieldBase);
  if (((this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestParsingMergeLite_RepeatedFieldsGenerator::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestParsingMergeLite.RepeatedFieldsGenerator)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.field1_.Clear();
  _impl_.field2_.Clear();
  _impl_.field3_.Clear();
  _impl_.group1_.Clear();
  _impl_.group2_.Clear();
  _impl_.ext1_.Clear();
  _impl_.ext2_.Clear();
  _internal_metadata_.Clear<std::string>();
}